

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_worker-inl.h
# Opt level: O1

void __thiscall
spdlog::details::periodic_worker::periodic_worker
          (periodic_worker *this,function<void_()> *callback_fun,seconds interval)

{
  id iVar1;
  id __tmp;
  long *plVar2;
  thread local_68;
  long *local_60;
  periodic_worker *local_58;
  _Any_data local_50;
  code *local_40;
  long local_30;
  
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->worker_thread_)._M_id._M_thread = 0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  std::condition_variable::condition_variable(&this->cv_);
  this->active_ = 0 < interval.__r;
  if (0 < interval.__r) {
    local_58 = this;
    std::function<void_()>::function((function<void_()> *)&local_50,callback_fun);
    local_68._M_id._M_thread = (id)0;
    local_30 = interval.__r;
    plVar2 = (long *)operator_new(0x38);
    *plVar2 = (long)&PTR___State_impl_0014aba8;
    plVar2[1] = (long)local_58;
    std::function<void_()>::function
              ((function<void_()> *)(plVar2 + 2),(function<void_()> *)&local_50);
    plVar2[6] = local_30;
    local_60 = plVar2;
    std::thread::_M_start_thread(&local_68,&local_60,0);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    iVar1._M_thread = (this->worker_thread_)._M_id._M_thread;
    if (iVar1._M_thread != 0) {
      std::terminate();
    }
    (this->worker_thread_)._M_id._M_thread = (native_handle_type)local_68._M_id._M_thread;
    if (local_40 != (code *)0x0) {
      local_68._M_id._M_thread = (id)(id)iVar1._M_thread;
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  return;
}

Assistant:

SPDLOG_INLINE periodic_worker::periodic_worker(const std::function<void()> &callback_fun, std::chrono::seconds interval)
{
    active_ = (interval > std::chrono::seconds::zero());
    if (!active_)
    {
        return;
    }

    worker_thread_ = std::thread([this, callback_fun, interval]() {
        for (;;)
        {
            std::unique_lock<std::mutex> lock(this->mutex_);
            if (this->cv_.wait_for(lock, interval, [this] { return !this->active_; }))
            {
                return; // active_ == false, so exit this thread
            }
            callback_fun();
        }
    });
}